

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execShiftRg<(moira::Instr)13,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  cnt = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) & 0x3f;
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  (*this->_vptr_Moira[0x19])(this,(ulong)(cnt * 2 + 4));
  uVar1 = shift<(moira::Instr)13,(moira::Size)4>
                    (this,cnt,(ulong)*(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58));
  *(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar1;
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = readD(src) & 0x3F;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}